

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::MultiVertexArrayStrideTests::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,MultiVertexArrayStrideTests *this,Spec *spec)

{
  ostream *poVar1;
  InputType type;
  long lVar2;
  long lVar3;
  stringstream name;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  lVar2 = 0;
  for (lVar3 = 0;
      lVar3 < (int)((ulong)((long)(spec->arrays).
                                  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(spec->arrays).
                                 super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 6); lVar3 = lVar3 + 1
      ) {
    poVar1 = std::operator<<(&local_1a8,"_");
    deqp::gls::Array::inputTypeToString_abi_cxx11_
              (&local_1d8,
               (Array *)(ulong)*(uint *)((long)&((spec->arrays).
                                                 super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                inputType + lVar2),type);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)((long)&((spec->arrays).
                                                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               componentCount + lVar2));
    poVar1 = std::operator<<(poVar1,"_");
    std::ostream::operator<<
              (poVar1,*(int *)((long)&((spec->arrays).
                                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->stride + lVar2));
    std::__cxx11::string::~string((string *)&local_1d8);
    lVar2 = lVar2 + 0x40;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayStrideTests::getTestName (const MultiVertexArrayTest::Spec& spec)
{
	std::stringstream name;

	name
		<< spec.arrays.size();

	for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
	{
		name
			<< "_"
			<< Array::inputTypeToString(spec.arrays[arrayNdx].inputType)
			<< spec.arrays[arrayNdx].componentCount << "_"
			<< spec.arrays[arrayNdx].stride;
	}

	return name.str();
}